

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

int history_def_next(void *p,HistEvent *ev)

{
  undefined8 *puVar1;
  history_t *h;
  HistEvent *ev_local;
  void *p_local;
  
  if (*(void **)((long)p + 0x28) == p) {
    ev->num = 5;
    ev->str = "empty list";
    p_local._4_4_ = -1;
  }
  else if (*(void **)(*(long *)((long)p + 0x28) + 0x18) == p) {
    ev->num = 6;
    ev->str = "no next event";
    p_local._4_4_ = -1;
  }
  else {
    *(undefined8 *)((long)p + 0x28) = *(undefined8 *)(*(long *)((long)p + 0x28) + 0x18);
    puVar1 = *(undefined8 **)((long)p + 0x28);
    *(undefined8 *)ev = *puVar1;
    ev->str = (char *)puVar1[1];
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int
history_def_next(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	if (h->cursor == &h->list) {
		he_seterrev(ev, _HE_EMPTY_LIST);
		return -1;
	}

	if (h->cursor->next == &h->list) {
		he_seterrev(ev, _HE_END_REACHED);
		return -1;
	}

        h->cursor = h->cursor->next;
        *ev = h->cursor->ev;

	return 0;
}